

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O2

void skip_variable(void)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = read_2_bytes();
  if (1 < uVar1) {
    iVar2 = uVar1 - 2;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      read_1_byte();
    }
    return;
  }
  fprintf(_stderr,"%s\n","Erroneous JPEG marker length");
  exit(1);
}

Assistant:

static void
skip_variable(void)
/* Skip over an unknown or uninteresting variable-length marker */
{
  unsigned int length;

  /* Get the marker parameter length count */
  length = read_2_bytes();
  /* Length includes itself, so must be at least 2 */
  if (length < 2)
    ERREXIT("Erroneous JPEG marker length");
  length -= 2;
  /* Skip over the remaining bytes */
  while (length > 0) {
    (void)read_1_byte();
    length--;
  }
}